

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

float __thiscall
crnlib::adaptive_arith_data_model::get_cost(adaptive_arith_data_model *this,uint sym)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  float fVar6;
  
  uVar2 = 1;
  fVar6 = 0.0;
  uVar3 = this->m_total_syms;
  do {
    uVar1 = (this->m_probs).m_p[uVar2].m_bit_0_prob;
    bVar5 = (uVar3 >> 1 & sym) != 0;
    uVar4 = 0x800 - uVar1;
    if (!bVar5) {
      uVar4 = (uint)uVar1;
    }
    fVar6 = fVar6 + (float)(&gProbCost)[uVar4];
    uVar2 = (ulong)((uint)bVar5 + (int)uVar2 * 2);
    bVar5 = 3 < uVar3;
    uVar3 = uVar3 >> 1;
  } while (bVar5);
  return fVar6;
}

Assistant:

float adaptive_arith_data_model::get_cost(uint sym) const
    {
        uint node = 1;

        uint bitmask = m_total_syms;

        float cost = 0.0f;
        do
        {
            bitmask >>= 1;

            uint bit = (sym & bitmask) ? 1 : 0;
            cost += m_probs[node].get_cost(bit);
            node = (node << 1) + bit;
        } while (bitmask > 1);

        return cost;
    }